

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lucas_test.hpp
# Opt level: O2

int lucasTest(int n)

{
  int n_00;
  long lVar1;
  int iVar2;
  unsigned_long __res;
  ulong uVar3;
  int iVar4;
  int k;
  int iVar5;
  ulong uVar6;
  int *__first;
  undefined8 uStack_80;
  int aiStack_78 [2];
  linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> local_70;
  undefined1 auStack_68 [8];
  vector<int,_std::allocator<int>_> factors;
  
  if (n == 1) {
    iVar5 = -1;
  }
  else if (n == 2) {
    iVar5 = 1;
  }
  else {
    iVar5 = 0;
    if ((n & 1U) != 0) {
      auStack_68 = (undefined1  [8])0x0;
      factors.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
           = (pointer)0x0;
      factors.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      iVar5 = n + -1;
      uStack_80 = 0x109c0a;
      primeFactors(iVar5,(vector<int,_std::allocator<int>_> *)auStack_68);
      lVar1 = -((ulong)(n - 3) * 4 + 0xf & 0xfffffffffffffff0);
      __first = (int *)((long)aiStack_78 + lVar1);
      *(undefined8 *)((long)aiStack_78 + lVar1 + -8) = 2;
      iVar4 = (int)*(undefined8 *)((long)aiStack_78 + lVar1 + -8);
      if (2 < n) {
        iVar4 = n;
      }
      for (uVar3 = 0; iVar4 - 2 != uVar3; uVar3 = uVar3 + 1) {
        __first[uVar3] = (int)uVar3 + 2;
      }
      *(undefined8 *)((long)aiStack_78 + lVar1 + -8) = 0x109c4f;
      uVar3 = time((time_t *)0x0);
      local_70._M_x = uVar3 % 0x7fffffff + (ulong)(uVar3 % 0x7fffffff == 0);
      *(undefined8 *)((long)aiStack_78 + lVar1 + -8) = 0x109c7e;
      std::shuffle<int*,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>>
                (__first,__first + (long)n + -3,&local_70);
      for (uVar3 = 0; uVar3 != iVar4 - 2; uVar3 = uVar3 + 1) {
        n_00 = __first[uVar3];
        *(undefined8 *)((long)aiStack_78 + lVar1 + -8) = 0x109c97;
        iVar2 = power(n_00,iVar5,n);
        if (iVar2 != 1) {
          iVar5 = 0;
          goto LAB_00109ce0;
        }
        uVar6 = 0;
        do {
          if ((ulong)((long)factors.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start - (long)auStack_68 >> 2) <= uVar6) {
            *(undefined8 *)((long)aiStack_78 + lVar1 + -8) = 1;
            goto LAB_00109cde;
          }
          iVar2 = *(int *)((long)auStack_68 + uVar6 * 4);
          *(undefined8 *)((long)aiStack_78 + lVar1 + -8) = 0x109ccb;
          iVar2 = power(n_00,iVar5 / iVar2,n);
          uVar6 = uVar6 + 1;
        } while (iVar2 != 1);
      }
      *(undefined8 *)((long)aiStack_78 + lVar1 + -8) = 0xffffffffffffffff;
LAB_00109cde:
      iVar5 = (int)*(undefined8 *)((long)aiStack_78 + lVar1 + -8);
LAB_00109ce0:
      uStack_80 = 0x109ced;
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                ((_Vector_base<int,_std::allocator<int>_> *)auStack_68);
    }
  }
  return iVar5;
}

Assistant:

inline int lucasTest(int n)
{
    // Base cases
    if (n == 1)
        return -1;
    if (n == 2)
        return 1; // Prime 
    if (n % 2 == 0)
        return 0; // Composite 

    // Generating and storing factors
    // of n-1
    std::vector<int> factors;
    primeFactors(n - 1, factors);
 
    // Array for random generator. This array
    // is to ensure one number is generated
    // only once
    int random[n - 3];
    for (int i = 0; i < n - 2; i++)
        random[i] = i + 2;
         
    // shuffle random array to produce randomness
    std::shuffle(random, random + n - 3, std::default_random_engine(time(0)));
 
    // Now one by one perform Lucas Primality
    // Test on random numbers generated.
    for (int i = 0; i < n - 2; ++i) {
        int a = random[i];
        if (power(a, n - 1, n) != 1)
            return 0; // composite
 
        // this is to check if every factor
        // of n-1 satisfy the condition
        bool flag = true;
        for (int k = 0; k < factors.size(); k++) {
            // if a^((n-1)/q) equal 1
            if (power(a, (n - 1) / factors[k], n) == 1) {
                flag = false;
                break;
            }
        }
 
        // if all condition satisfy
        if (flag)
            return 1; // prime
    }
    return -1; // probably composite
}